

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void setAuxBits(randomTape_t *tapes,uint8_t *input,picnic_instance_t *params)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint8_t *bytes;
  uint8_t val;
  ushort *in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  size_t i;
  size_t j;
  size_t inBit;
  size_t last;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  bVar1 = *(byte *)((long)in_RDX + 0xb);
  local_28 = 0;
  for (local_30 = 0; local_30 < *(byte *)((long)in_RDX + 3); local_30 = local_30 + 1) {
    for (local_38 = 0; local_38 < *in_RDX; local_38 = local_38 + 1) {
      bytes = *(uint8_t **)(in_RDI + (long)(int)(bVar1 - 1) * 8);
      uVar2 = *in_RDX;
      uVar3 = *in_RDX;
      val = getBit(in_RSI,local_28);
      setBit(bytes,(ulong)uVar2 + (long)(int)((uint)uVar3 << 1) * local_30 + local_38,val);
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

static void setAuxBits(randomTape_t* tapes, uint8_t* input, const picnic_instance_t* params) {
  size_t last  = params->num_MPC_parties - 1;
  size_t inBit = 0;

  for (size_t j = 0; j < params->lowmc.r; j++) {
    for (size_t i = 0; i < params->lowmc.n; i++) {
      setBit(tapes->tape[last], params->lowmc.n + params->lowmc.n * 2 * (j) + i,
             getBit(input, inBit++));
    }
  }
}